

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool mz_zip_writer_init_heap
                  (mz_zip_archive *pZip,size_t size_to_reserve_at_beginning,
                  size_t initial_allocation_size)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  void *pvVar3;
  mz_bool mVar4;
  
  pZip->m_pWrite = (anonymous_namespace)::miniz::mz_zip_heap_write_func;
  pZip->m_pIO_opaque = pZip;
  mVar2 = mz_zip_writer_init(pZip,size_to_reserve_at_beginning);
  mVar4 = 0;
  if (mVar2 != 0) {
    if (size_to_reserve_at_beginning < initial_allocation_size) {
      size_to_reserve_at_beginning = initial_allocation_size;
    }
    if (size_to_reserve_at_beginning != 0) {
      pvVar3 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,size_to_reserve_at_beginning);
      pmVar1 = pZip->m_pState;
      pmVar1->m_pMem = pvVar3;
      if (pvVar3 == (void *)0x0) {
        mz_zip_writer_end(pZip);
        return 0;
      }
      pmVar1->m_mem_capacity = size_to_reserve_at_beginning;
    }
    mVar4 = 1;
  }
  return mVar4;
}

Assistant:

mz_bool mz_zip_writer_init_heap(mz_zip_archive *pZip,
                                size_t size_to_reserve_at_beginning,
                                size_t initial_allocation_size) {
  pZip->m_pWrite = mz_zip_heap_write_func;
  pZip->m_pIO_opaque = pZip;
  if (!mz_zip_writer_init(pZip, size_to_reserve_at_beginning))
    return MZ_FALSE;
  if (0 != (initial_allocation_size = MZ_MAX(initial_allocation_size,
                                             size_to_reserve_at_beginning))) {
    if (NULL == (pZip->m_pState->m_pMem = pZip->m_pAlloc(
                     pZip->m_pAlloc_opaque, 1, initial_allocation_size))) {
      mz_zip_writer_end(pZip);
      return MZ_FALSE;
    }
    pZip->m_pState->m_mem_capacity = initial_allocation_size;
  }
  return MZ_TRUE;
}